

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_exception.c
# Opt level: O2

int exception_decrement_reference(exception ex)

{
  int iVar1;
  
  iVar1 = 1;
  if ((ex != (exception)0x0) && ((ex->ref).count != 0)) {
    LOCK();
    (ex->ref).count = (ex->ref).count - 1;
    UNLOCK();
    LOCK();
    exception_stats.decrements = exception_stats.decrements + 1;
    UNLOCK();
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int exception_decrement_reference(exception ex)
{
	if (ex == NULL)
	{
		return 1;
	}

	if (threading_atomic_ref_count_decrement(&ex->ref) == 1)
	{
		return 1;
	}

	reflect_memory_tracker_decrement(exception_stats);

	return 0;
}